

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0005(SemanticModelTester *this)

{
  Symbol *pSVar1;
  DeclarationCategory DVar2;
  SymbolKind SVar3;
  bool bVar4;
  TypeKind TVar5;
  int iVar6;
  undefined4 extraout_var;
  Lexeme *pLVar8;
  Type *pTVar9;
  undefined4 extraout_var_00;
  ostream *poVar10;
  ostream *poVar11;
  undefined8 uVar12;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  SemanticModel *local_28;
  VariableAndOrFunctionDeclarationSyntax *local_20;
  ObjectDeclarationSymbol *pOVar7;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"x y , z ;",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&syms,"",&local_6a);
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd8,(string *)this,&local_68);
  std::__cxx11::string::~string((string *)&syms);
  std::__cxx11::string::~string((string *)&local_68);
  SemanticModel::variablesAndOrFunctionsFor(&syms,local_28,local_20);
  if ((long)syms.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)syms.
            super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,2);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xaf);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&TestFailed::typeinfo,0);
  }
  pSVar1 = &(*syms.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_Symbol;
  if (pSVar1 == (Symbol *)0x0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
    poVar11 = std::operator<<(poVar11,"true");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar10 = (ostream *)std::operator<<(poVar11,":");
    iVar6 = 0xb2;
  }
  else {
    DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
    if (DVar2 == Object) {
      SVar3 = Symbol::kind(pSVar1);
      if (SVar3 == VariableDeclaration) {
        iVar6 = (*pSVar1->_vptr_Symbol[0xd])(pSVar1);
        pOVar7 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar6);
        pLVar8 = &ObjectDeclarationSymbol::name(pOVar7)->super_Lexeme;
        Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
        bVar4 = std::operator==(&local_68,"y");
        std::__cxx11::string::~string((string *)&local_68);
        if (bVar4) {
          pTVar9 = ObjectDeclarationSymbol::type(pOVar7);
          TVar5 = Type::kind(pTVar9);
          if (TVar5 == Error) {
            pSVar1 = &syms.
                      super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]->super_Symbol;
            if (pSVar1 == (Symbol *)0x0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
              poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
              poVar11 = std::operator<<(poVar11,"true");
              poVar11 = std::operator<<(poVar11,"\n");
              poVar11 = std::operator<<(poVar11,"\t\t");
              poVar11 = std::operator<<(poVar11,
                                        "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                       );
              poVar10 = (ostream *)std::operator<<(poVar11,":");
              iVar6 = 0xba;
            }
            else {
              DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
              if (DVar2 == Object) {
                SVar3 = Symbol::kind(pSVar1);
                if (SVar3 == VariableDeclaration) {
                  iVar6 = (*pSVar1->_vptr_Symbol[0xd])(pSVar1);
                  pOVar7 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var_00,iVar6);
                  pLVar8 = &ObjectDeclarationSymbol::name(pOVar7)->super_Lexeme;
                  Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
                  bVar4 = std::operator==(&local_68,"z");
                  std::__cxx11::string::~string((string *)&local_68);
                  if (bVar4) {
                    pTVar9 = ObjectDeclarationSymbol::type(pOVar7);
                    TVar5 = Type::kind(pTVar9);
                    if (TVar5 == Error) {
                      std::
                      _Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                      ::~_Vector_base(&syms.
                                       super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                                     );
                      return;
                    }
                    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                    pTVar9 = ObjectDeclarationSymbol::type(pOVar7);
                    TVar5 = Type::kind(pTVar9);
                    poVar11 = ::operator<<(poVar11,TVar5);
                    poVar11 = std::operator<<(poVar11,"\n");
                    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                    poVar11 = std::operator<<(poVar11,"Error");
                    poVar11 = std::operator<<(poVar11,"\n");
                    poVar11 = std::operator<<(poVar11,"\t\t");
                    poVar11 = std::operator<<(poVar11,
                                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                             );
                    poVar11 = std::operator<<(poVar11,":");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xbf);
                    std::endl<char,std::char_traits<char>>(poVar11);
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                    pLVar8 = &ObjectDeclarationSymbol::name(pOVar7)->super_Lexeme;
                    Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
                    poVar11 = std::operator<<(poVar11,(string *)&local_68);
                    poVar11 = std::operator<<(poVar11,"\n");
                    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                    poVar11 = std::operator<<(poVar11,"z");
                    poVar11 = std::operator<<(poVar11,"\n");
                    poVar11 = std::operator<<(poVar11,"\t\t");
                    poVar11 = std::operator<<(poVar11,
                                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                             );
                    poVar11 = std::operator<<(poVar11,":");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xbe);
                    std::endl<char,std::char_traits<char>>(poVar11);
                    std::__cxx11::string::~string((string *)&local_68);
                  }
                  uVar12 = __cxa_allocate_exception(1);
                  __cxa_throw(uVar12,&TestFailed::typeinfo,0);
                }
                poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                SVar3 = Symbol::kind(pSVar1);
                poVar11 = C::operator<<(poVar11,SVar3);
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                poVar11 = std::operator<<(poVar11,"VariableDeclaration");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\t");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                         );
                poVar10 = (ostream *)std::operator<<(poVar11,":");
                iVar6 = 0xbc;
              }
              else {
                poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
                poVar11 = C::operator<<(poVar11,DVar2);
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                poVar11 = std::operator<<(poVar11,"Object");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\t");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                         );
                poVar10 = (ostream *)std::operator<<(poVar11,":");
                iVar6 = 0xbb;
              }
            }
            poVar11 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
            std::endl<char,std::char_traits<char>>(poVar11);
            uVar12 = __cxa_allocate_exception(1);
            __cxa_throw(uVar12,&TestFailed::typeinfo,0);
          }
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          pTVar9 = ObjectDeclarationSymbol::type(pOVar7);
          TVar5 = Type::kind(pTVar9);
          poVar11 = ::operator<<(poVar11,TVar5);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"Error");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xb7);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          pLVar8 = &ObjectDeclarationSymbol::name(pOVar7)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_68,pLVar8);
          poVar11 = std::operator<<(poVar11,(string *)&local_68);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"y");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xb6);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string((string *)&local_68);
        }
        uVar12 = __cxa_allocate_exception(1);
        __cxa_throw(uVar12,&TestFailed::typeinfo,0);
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      SVar3 = Symbol::kind(pSVar1);
      poVar11 = C::operator<<(poVar11,SVar3);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"VariableDeclaration");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar10 = (ostream *)std::operator<<(poVar11,":");
      iVar6 = 0xb4;
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      DVar2 = DeclarationSymbol::category((DeclarationSymbol *)pSVar1);
      poVar11 = C::operator<<(poVar11,DVar2);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"Object");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar10 = (ostream *)std::operator<<(poVar11,":");
      iVar6 = 0xb3;
    }
  }
  poVar11 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
  std::endl<char,std::char_traits<char>>(poVar11);
  uVar12 = __cxa_allocate_exception(1);
  __cxa_throw(uVar12,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0005()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("x y , z ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym1 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(varDeclSym1->type()->kind(), TypeKind::Error, TypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym2 = declSym1->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym2->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(varDeclSym2->type()->kind(), TypeKind::Error, TypeKind);
}